

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleZomby.cpp
# Opt level: O2

void __thiscall SimpleZomby::Zomby::~Zomby(Zomby *this)

{
  char *pcVar1;
  element_type *peVar2;
  ostream *poVar3;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  ostringstream buf;
  undefined1 local_1d8 [40];
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  LOCK();
  (this->_semaphore)._M_base._M_i = false;
  UNLOCK();
  if ((this->_thread)._M_id._M_thread != 0) {
    std::thread::detach();
  }
  if ((this->_listener).super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    pcVar1 = *(char **)((this->super_Manager)._vptr_Manager[-1] + 8);
    poVar3 = std::operator<<((ostream *)local_190,pcVar1 + (*pcVar1 == '*'));
    poVar3 = std::operator<<(poVar3,"::");
    poVar3 = std::operator<<(poVar3,"~Zomby");
    std::endl<char,std::char_traits<char>>(poVar3);
    peVar2 = (this->_listener).super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__cxx11::stringbuf::str();
    sVar4 = std::make_shared<std::__cxx11::string,std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8);
    local_1d8._16_8_ = local_1d8._0_8_;
    local_1d8._24_8_ = local_1d8._8_8_;
    local_1d8._0_8_ = (pointer)0x0;
    local_1d8._8_8_ = 0;
    (*peVar2->_vptr_Listener[2])
              (peVar2,local_1d8 + 0x10,
               sVar4.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi._M_pi);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 0x18));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  std::thread::~thread(&this->_thread);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_listener).super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<SimpleZomby::Zomby>)._M_weak_this.
              super___weak_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Zomby::~Zomby()
{
    _semaphore = false;

    if (_thread.joinable()) {
        _thread.detach();
    }

    if (_listener) {
        std::ostringstream buf;
        buf << typeid(*this).name() << "::" << __func__ << std::endl;
        _listener->processData(std::make_shared<Common::Listener::Data>(buf.str()));
    }
}